

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndDisabled(void)

{
  uint uVar1;
  ImGuiItemFlags IVar2;
  ImGuiContext_conflict1 *pIVar3;
  uint *puVar4;
  
  pIVar3 = GImGui;
  if (0 < GImGui->DisabledStackSize) {
    GImGui->DisabledStackSize = GImGui->DisabledStackSize + -1;
    IVar2 = pIVar3->CurrentItemFlags;
    ImVector<int>::pop_back(&pIVar3->ItemFlagsStack);
    puVar4 = (uint *)ImVector<int>::back(&pIVar3->ItemFlagsStack);
    uVar1 = *puVar4;
    pIVar3->CurrentItemFlags = uVar1;
    if (((uVar1 & 4) == 0 & (byte)IVar2 >> 2) == 1) {
      (pIVar3->Style).Alpha = pIVar3->DisabledAlphaBackup;
    }
    return;
  }
  __assert_fail("g.DisabledStackSize > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x1c25,"void ImGui::EndDisabled()");
}

Assistant:

void ImGui::EndDisabled()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.DisabledStackSize > 0);
    g.DisabledStackSize--;
    bool was_disabled = (g.CurrentItemFlags & ImGuiItemFlags_Disabled) != 0;
    //PopItemFlag();
    g.ItemFlagsStack.pop_back();
    g.CurrentItemFlags = g.ItemFlagsStack.back();
    if (was_disabled && (g.CurrentItemFlags & ImGuiItemFlags_Disabled) == 0)
        g.Style.Alpha = g.DisabledAlphaBackup; //PopStyleVar();
}